

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# City.cpp
# Opt level: O2

uint128 CityHash128WithSeed(char *s,size_t len,uint128 seed)

{
  uint64 uVar1;
  uint64 uVar2;
  uint64 uVar3;
  uint64 uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_long uVar8;
  uint64 uVar9;
  long lVar10;
  char *s_00;
  long *plVar11;
  ulong uVar12;
  long lVar13;
  pair<unsigned_long,_unsigned_long> pVar14;
  pair<unsigned_long,_unsigned_long> pVar15;
  uint128 uVar16;
  long local_58;
  
  uVar7 = seed.second;
  uVar4 = seed.first;
  if (len < 0x80) {
    if (len < 0x11) {
      uVar12 = (uVar4 * -0x4b6d499041670d8d >> 0x2f ^ uVar4 * -0x4b6d499041670d8d) *
               -0x4b6d499041670d8d;
      uVar1 = HashLen0to16(s,len);
      uVar1 = uVar1 + uVar7 * -0x4b6d499041670d8d;
      uVar4 = uVar1;
      if (7 < len) {
        uVar4 = *(uint64 *)s;
      }
      uVar9 = uVar4 + uVar12 >> 0x2f ^ uVar4 + uVar12;
    }
    else {
      uVar1 = HashLen16(*(long *)(s + (len - 8)) + 0xb492b66fbe98f273,uVar4);
      uVar9 = HashLen16(uVar7 + len,uVar1 + *(long *)(s + (len - 0x10)));
      uVar12 = uVar9 + uVar4;
      uVar6 = len + 0x10;
      do {
        lVar10 = *(long *)s;
        uVar6 = uVar6 - 0x10;
        plVar11 = (long *)((long)s + 8);
        s = (char *)((long)s + 0x10);
        uVar12 = (((ulong)(lVar10 * -0x4b6d499041670d8d) >> 0x2f ^ lVar10 * -0x4b6d499041670d8d) *
                  -0x4b6d499041670d8d ^ uVar12) * -0x4b6d499041670d8d;
        uVar7 = uVar7 ^ uVar12;
        uVar1 = (((ulong)(*plVar11 * -0x4b6d499041670d8d) >> 0x2f ^ *plVar11 * -0x4b6d499041670d8d)
                 * -0x4b6d499041670d8d ^ uVar1) * -0x4b6d499041670d8d;
        uVar9 = uVar9 ^ uVar1;
      } while (0x20 < uVar6);
    }
    uVar2 = HashLen16(uVar12,uVar1);
    uVar3 = HashLen16(uVar9,uVar7);
    uVar7 = uVar3 ^ uVar2;
  }
  else {
    uVar6 = len * -0x4b6d499041670d8d;
    s_00 = s + 0x40;
    uVar12 = ((uVar7 ^ 0xb492b66fbe98f273) >> 0x31 | (uVar7 ^ 0xb492b66fbe98f273) << 0xf) *
             -0x4b6d499041670d8d + *(long *)s;
    pVar14.second = (uVar12 >> 0x2a | uVar12 * 0x400000) * -0x4b6d499041670d8d + *(long *)(s + 8);
    pVar14.first = uVar12;
    pVar15.second =
         (*(long *)(s + 0x58) + uVar4 >> 0x35 | (*(long *)(s + 0x58) + uVar4) * 0x800) *
         -0x4b6d499041670d8d;
    pVar15.first = (uVar6 + uVar7 >> 0x23 | (uVar6 + uVar7) * 0x20000000) * -0x4b6d499041670d8d +
                   uVar4;
    sVar5 = len;
    do {
      uVar6 = uVar6 + pVar15.first;
      uVar12 = uVar4 + pVar14.first + uVar7 + *(long *)(s_00 + -0x38);
      uVar7 = uVar7 + pVar14.second + *(long *)(s_00 + -0x10);
      lVar13 = (uVar6 >> 0x21 | uVar6 * 0x80000000) * -0x4b6d499041670d8d;
      uVar12 = (uVar12 >> 0x25 | uVar12 * 0x8000000) * -0x4b6d499041670d8d ^ pVar15.second;
      lVar10 = pVar14.first + *(long *)(s_00 + -0x18) +
               (uVar7 >> 0x2a | uVar7 * 0x400000) * -0x4b6d499041670d8d;
      pVar14 = WeakHashLen32WithSeeds
                         (s_00 + -0x40,pVar14.second * -0x4b6d499041670d8d,pVar15.first + uVar12);
      pVar15 = WeakHashLen32WithSeeds
                         (s_00 + -0x20,pVar15.second + lVar13,*(long *)(s_00 + -0x30) + lVar10);
      uVar12 = uVar12 + pVar15.first;
      uVar6 = lVar13 + lVar10 + pVar14.first + *(long *)(s_00 + 8);
      uVar4 = (uVar12 >> 0x21 | uVar12 * 0x80000000) * -0x4b6d499041670d8d;
      uVar7 = lVar10 + pVar14.second + *(long *)(s_00 + 0x30);
      uVar6 = (uVar6 >> 0x25 | uVar6 * 0x8000000) * -0x4b6d499041670d8d ^ pVar15.second;
      uVar7 = pVar14.first + *(long *)(s_00 + 0x28) +
              (uVar7 >> 0x2a | uVar7 * 0x400000) * -0x4b6d499041670d8d;
      pVar14 = WeakHashLen32WithSeeds(s_00,pVar14.second * -0x4b6d499041670d8d,pVar15.first + uVar6)
      ;
      pVar15 = WeakHashLen32WithSeeds
                         (s_00 + 0x20,pVar15.second + uVar4,*(long *)(s_00 + 0x10) + uVar7);
      s_00 = s_00 + 0x80;
      sVar5 = sVar5 - 0x80;
    } while (0x7f < sVar5);
    uVar12 = pVar14.first + uVar6;
    local_58 = (pVar15.first >> 0x25 | pVar15.first << 0x1b) * -0x3c5a37a36834ced9 + uVar6;
    uVar4 = (uVar12 >> 0x31 | uVar12 * 0x8000) * -0x3c5a37a36834ced9 + uVar4;
    plVar11 = (long *)(s + (len - 0x20));
    uVar12 = 0;
    while( true ) {
      uVar9 = pVar15.second;
      uVar1 = pVar14.second;
      uVar2 = pVar14.first;
      if (sVar5 <= uVar12) break;
      uVar8 = pVar15.first + plVar11[2];
      uVar12 = uVar12 + 0x20;
      local_58 = local_58 + uVar9 + *plVar11;
      uVar7 = (uVar7 + uVar4 >> 0x2a | (uVar7 + uVar4) * 0x400000) * -0x3c5a37a36834ced9 + uVar1;
      uVar4 = uVar4 * -0x3c5a37a36834ced9 + uVar8;
      pVar14 = WeakHashLen32WithSeeds((char *)plVar11,uVar2 + local_58,uVar1);
      pVar15.second = uVar9 + uVar2;
      pVar15.first = uVar8;
      plVar11 = plVar11 + -4;
    }
    uVar3 = HashLen16(uVar4,uVar2);
    uVar2 = HashLen16(uVar7 + local_58,pVar15.first);
    uVar4 = HashLen16(uVar3 + uVar1,uVar9);
    uVar7 = uVar4 + uVar2;
    uVar3 = uVar3 + uVar9;
    uVar2 = uVar2 + uVar1;
  }
  uVar4 = HashLen16(uVar3,uVar2);
  uVar16.second = uVar4;
  uVar16.first = uVar7;
  return uVar16;
}

Assistant:

uint128 CityHash128WithSeed(const char *s, size_t len, uint128 seed) {
  if (len < 128) {
    return CityMurmur(s, len, seed);
  }

  // We expect len >= 128 to be the common case.  Keep 56 bytes of state:
  // v, w, x, y, and z.
  pair<uint64, uint64> v, w;
  uint64 x = Uint128Low64(seed);
  uint64 y = Uint128High64(seed);
  uint64 z = len * k1;
  v.first = Rotate(y ^ k1, 49) * k1 + Fetch64(s);
  v.second = Rotate(v.first, 42) * k1 + Fetch64(s + 8);
  w.first = Rotate(y + z, 35) * k1 + x;
  w.second = Rotate(x + Fetch64(s + 88), 53) * k1;

  // This is the same inner loop as CityHash64(), manually unrolled.
  do {
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    len -= 128;
  } while (LIKELY(len >= 128));
  x += Rotate(v.first + z, 49) * k0;
  z += Rotate(w.first, 37) * k0;
  // If 0 < len < 128, hash up to 4 chunks of 32 bytes each from the end of s.
  for (size_t tail_done = 0; tail_done < len; ) {
    tail_done += 32;
    y = Rotate(x + y, 42) * k0 + v.second;
    w.first += Fetch64(s + len - tail_done + 16);
    x = x * k0 + w.first;
    z += w.second + Fetch64(s + len - tail_done);
    w.second += v.first;
    v = WeakHashLen32WithSeeds(s + len - tail_done, v.first + z, v.second);
  }
  // At this point our 56 bytes of state should contain more than
  // enough information for a strong 128-bit hash.  We use two
  // different 56-byte-to-8-byte hashes to get a 16-byte final result.
  x = HashLen16(x, v.first);
  y = HashLen16(y + z, w.first);
  return uint128(HashLen16(x + v.second, w.second) + y,
                 HashLen16(x + w.second, y + v.second));
}